

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall cmCTest::SetStopTime(cmCTest *this,string *time_str)

{
  int iVar1;
  int iVar2;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var3;
  tm *ptVar4;
  time_t tVar5;
  time_t tVar6;
  int iVar7;
  int iVar8;
  time_t current_time;
  char buf [1024];
  
  current_time = time((time_t *)0x0);
  ptVar4 = gmtime(&current_time);
  iVar1 = ptVar4->tm_hour;
  tVar5 = mktime(ptVar4);
  ptVar4 = localtime(&current_time);
  iVar2 = ptVar4->tm_hour;
  iVar7 = iVar2 - iVar1;
  if ((iVar7 == 0 || iVar2 < iVar1) || tVar5 <= current_time) {
    iVar8 = iVar7 + 0x18;
    if (iVar1 <= iVar2) {
      iVar8 = iVar7;
    }
    if (current_time <= tVar5) {
      iVar8 = iVar7;
    }
  }
  else {
    iVar8 = iVar7 + -0x18;
  }
  snprintf(buf,0x400,"%d%02d%02d %s %+05i",(ulong)(ptVar4->tm_year + 0x76c),
           (ulong)(ptVar4->tm_mon + 1),(ulong)(uint)ptVar4->tm_mday,(time_str->_M_dataplus)._M_p,
           (ulong)(uint)(iVar8 * 100));
  tVar6 = curl_getdate(buf,&current_time);
  if (tVar6 == -1) {
    (((this->Impl)._M_t.
      super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
      super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
      super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->StopTime).__d = (duration)0x0;
  }
  else {
    _Var3._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    ((_Var3._M_head_impl)->StopTime).__d = (duration)(tVar6 * 1000000000);
    if (tVar6 < current_time) {
      ((_Var3._M_head_impl)->StopTime).__d = (duration)(tVar6 * 1000000000 + 86400000000000);
    }
  }
  return;
}

Assistant:

void cmCTest::SetStopTime(std::string const& time_str)
{

  struct tm* lctime;
  time_t current_time = time(nullptr);
  lctime = gmtime(&current_time);
  int gm_hour = lctime->tm_hour;
  time_t gm_time = mktime(lctime);
  lctime = localtime(&current_time);
  int local_hour = lctime->tm_hour;

  int tzone_offset = local_hour - gm_hour;
  if (gm_time > current_time && gm_hour < local_hour) {
    // this means gm_time is on the next day
    tzone_offset -= 24;
  } else if (gm_time < current_time && gm_hour > local_hour) {
    // this means gm_time is on the previous day
    tzone_offset += 24;
  }

  tzone_offset *= 100;
  char buf[1024];
  snprintf(buf, sizeof(buf), "%d%02d%02d %s %+05i", lctime->tm_year + 1900,
           lctime->tm_mon + 1, lctime->tm_mday, time_str.c_str(),
           tzone_offset);

  time_t stop_time = curl_getdate(buf, &current_time);
  if (stop_time == -1) {
    this->Impl->StopTime = std::chrono::system_clock::time_point();
    return;
  }
  this->Impl->StopTime = std::chrono::system_clock::from_time_t(stop_time);

  if (stop_time < current_time) {
    this->Impl->StopTime += std::chrono::hours(24);
  }
}